

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImU32 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiID tab_id_1;
  ImGuiDockNode *node;
  ImGuiWindow *window;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  ImGuiID in_stack_ffffffffffffffbc;
  uint3 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  ImGuiTabBar *in_stack_ffffffffffffffc8;
  
  uVar3 = (uint)in_stack_ffffffffffffffc0;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    uVar3 = CONCAT13((GImGui->CurrentTabBar->Flags & 0x100000U) != 0,in_stack_ffffffffffffffc0) ^
            0xff000000;
  }
  if ((uVar3 & 0x1000000) == 0) {
    pIVar2 = FindWindowByName((char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3));
    if (((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar2->field_0x43a & 1) != 0)) &&
       (pIVar2->DockNode != (ImGuiDockNode *)0x0)) {
      IVar1 = TabBarCalcTabID((ImGuiTabBar *)pIVar2->DockNode,
                              (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3));
      TabBarRemoveTab((ImGuiTabBar *)CONCAT44(IVar1,uVar3),in_stack_ffffffffffffffbc);
      pIVar2->field_0x43a = pIVar2->field_0x43a & 0xfb | 4;
    }
  }
  else {
    TabBarCalcTabID(in_stack_ffffffffffffffc8,(char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3));
    TabBarRemoveTab((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),
                    in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}